

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O3

BigInt * __thiscall BigInt::operator-(BigInt *__return_storage_ptr__,BigInt *this,BigInt *b)

{
  ulong uVar1;
  BigInt temp;
  BigInt local_40;
  
  std::vector<int,_std::allocator<int>_>::vector(&local_40.value,&b->value);
  uVar1._0_4_ = b->real_length;
  uVar1._4_4_ = b->sign;
  local_40.sign._0_1_ = uVar1 >> 0x20 == 0;
  local_40.real_length = (undefined4)uVar1;
  local_40.sign._1_3_ = 0;
  *local_40.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
   _M_start = (uint)local_40.sign._0_1_;
  add(__return_storage_ptr__,this,&local_40);
  if ((uint *)local_40.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_40.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

BigInt BigInt::operator-(BigInt&& b) {
    BigInt temp = b;
    temp.set_sign(!b.get_positive_sign());
    return this->add(temp);
}